

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

QByteArrayView __thiscall
QIODevice::readLineInto(QIODevice *this,QSpan<std::byte,_18446744073709551615UL> buffer)

{
  long lVar1;
  QByteArrayView QVar2;
  bool bVar3;
  QFlags<QIODeviceBase::OpenModeFlag> QVar4;
  QIODevicePrivate *c;
  size_type_conflict sVar5;
  ulong uVar6;
  qsizetype qVar7;
  QByteArrayView *this_00;
  qint64 qVar8;
  QIODevice *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qint64 readBytes;
  qint64 maxSize;
  QIODevicePrivate *d;
  OpenModeFlag in_stack_ffffffffffffff4c;
  OpenModeFlag in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QSpan<std::byte,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  QByteArrayView *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffd0;
  Int IVar9;
  undefined4 in_stack_ffffffffffffffd4;
  ReadLineOption option;
  char *in_stack_ffffffffffffffe8;
  QIODevicePrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  c = d_func((QIODevice *)0x2c5f90);
  sVar5 = QSpan<std::byte,_18446744073709551615UL>::size
                    ((QSpan<std::byte,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
  QVar4 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero
            ((CompareAgainstLiteralZero *)&stack0xffffffffffffffd7,0);
  bVar3 = ::operator==(QVar4.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  if (bVar3) {
    IVar9 = (c->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
            super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
    bVar3 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                         SUB84((ulong)in_stack_ffffffffffffff58 >> 0x20,0),in_stack_ffffffffffffff50
                        );
    if (bVar3) {
      checkWarnMessage(in_RDX,(char *)in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffd4,IVar9));
      QByteArrayView::QByteArrayView((QByteArrayView *)&stack0xffffffffffffffe8);
    }
    else {
      checkWarnMessage(in_RDX,(char *)in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffd4,IVar9));
      QByteArrayView::QByteArrayView((QByteArrayView *)&stack0xffffffffffffffe8);
    }
  }
  else {
    uVar6 = (**(code **)(*in_RDI + 0x90))();
    if ((uVar6 & 1) == 0) {
      if (sVar5 < 1) {
        checkWarnMessage(in_RDX,(char *)in_RSI,
                         (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        QByteArrayView::QByteArrayView((QByteArrayView *)&stack0xffffffffffffffe8);
      }
      else {
        qVar7 = QByteArray::maxSize();
        if (qVar7 <= sVar5) {
          checkWarnMessage(in_RDX,(char *)in_RSI,
                           (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          QByteArray::maxSize();
        }
        option = (ReadLineOption)((ulong)in_RSI >> 0x20);
        this_00 = (QByteArrayView *)
                  QSpan<std::byte,_18446744073709551615UL>::data
                            ((QSpan<std::byte,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
        QSpan<std::byte,_18446744073709551615UL>::size
                  ((QSpan<std::byte,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
        qVar8 = QIODevicePrivate::readLine
                          (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(qint64)in_RDX,option
                          );
        if (qVar8 < 0) {
          QByteArrayView::QByteArrayView((QByteArrayView *)&stack0xffffffffffffffe8);
        }
        else {
          QSpan<std::byte,_18446744073709551615UL>::first
                    ((QSpan<std::byte,_18446744073709551615UL> *)this_00,(size_type_conflict)c);
          QByteArrayView::QByteArrayView<QSpan<std::byte,_18446744073709551615UL>,_true>
                    (this_00,(QSpan<std::byte,_18446744073709551615UL> *)c);
        }
      }
    }
    else {
      QSpan<std::byte,_18446744073709551615UL>::first
                ((QSpan<std::byte,_18446744073709551615UL> *)in_stack_ffffffffffffff60,
                 (size_type_conflict)in_stack_ffffffffffffff58);
      QByteArrayView::QByteArrayView<QSpan<std::byte,_18446744073709551615UL>,_true>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2.m_data._0_4_ = (int)in_stack_fffffffffffffff0;
    QVar2.m_size = (qsizetype)in_stack_ffffffffffffffe8;
    QVar2.m_data._4_4_ = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QByteArrayView QIODevice::readLineInto(QSpan<std::byte> buffer)
{
    Q_D(QIODevice);
    qint64 maxSize = buffer.size();
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::readLineInto(%lld), d->pos = %lld, d->buffer.size() = %lld\n",
           this, qlonglong(maxSize), qlonglong(d->pos), qlonglong(d->buffer.size()));
#endif

    CHECK_READABLE(readLineInto, {});

    if (atEnd())
        return buffer.first(0);

    CHECK_LINEMAXLEN_1(readLineInto, {});
    CHECK_MAXBYTEARRAYSIZE(readLineInto);

    const qint64 readBytes = d->readLine(reinterpret_cast<char*>(buffer.data()), buffer.size(),
                                         QIODevicePrivate::ReadLineOption::NotNullTerminated);

    if (readBytes < 0)
        return {};

    return buffer.first(readBytes);
}